

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_deep_copy(REF_GRID *ref_grid_ptr,REF_GRID original)

{
  uint uVar1;
  REF_GRID pRVar2;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GRID ref_grid;
  REF_INT group;
  REF_GRID original_local;
  REF_GRID *ref_grid_ptr_local;
  
  pRVar2 = (REF_GRID)malloc(0x110);
  *ref_grid_ptr = pRVar2;
  if (*ref_grid_ptr == (REF_GRID)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x50,
           "ref_grid_deep_copy","malloc *ref_grid_ptr of REF_GRID_STRUCT NULL");
    ref_grid_ptr_local._4_4_ = 2;
  }
  else {
    pRVar2 = *ref_grid_ptr;
    ref_grid_ptr_local._4_4_ = ref_mpi_deep_copy(&pRVar2->mpi,original->mpi);
    if (ref_grid_ptr_local._4_4_ == 0) {
      ref_grid_ptr_local._4_4_ = ref_node_deep_copy(&pRVar2->node,pRVar2->mpi,original->node);
      if (ref_grid_ptr_local._4_4_ == 0) {
        for (ref_grid._4_4_ = 0; ref_grid._4_4_ < 0x10; ref_grid._4_4_ = ref_grid._4_4_ + 1) {
          uVar1 = ref_cell_deep_copy(pRVar2->cell + ref_grid._4_4_,original->cell[ref_grid._4_4_]);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x5e,"ref_grid_deep_copy",(ulong)uVar1,"cell deep copy");
            return uVar1;
          }
        }
        pRVar2->cell[0x10] = (REF_CELL)0x0;
        ref_grid_ptr_local._4_4_ = ref_geom_deep_copy(&pRVar2->geom,original->geom);
        if (ref_grid_ptr_local._4_4_ == 0) {
          ref_grid_ptr_local._4_4_ = ref_gather_create(&pRVar2->gather);
          if (ref_grid_ptr_local._4_4_ == 0) {
            ref_grid_ptr_local._4_4_ = ref_adapt_deep_copy(&pRVar2->adapt,original->adapt);
            if (ref_grid_ptr_local._4_4_ == 0) {
              pRVar2->interp = (REF_INTERP)0x0;
              pRVar2->partitioner = original->partitioner;
              pRVar2->partitioner_seed = 0;
              pRVar2->partitioner_full = original->partitioner_full;
              pRVar2->meshb_version = 0;
              pRVar2->coordinate_system = original->coordinate_system;
              pRVar2->unit = original->unit;
              pRVar2->references[0] = original->references[0];
              pRVar2->references[1] = original->references[1];
              pRVar2->references[2] = original->references[2];
              pRVar2->references[3] = original->references[3];
              pRVar2->references[4] = original->references[4];
              pRVar2->references[5] = original->references[5];
              pRVar2->references[6] = original->references[6];
              pRVar2->twod = original->twod;
              pRVar2->surf = original->surf;
              ref_grid_ptr_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x67,"ref_grid_deep_copy",(ulong)ref_grid_ptr_local._4_4_,"adapt deep copy");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x65,"ref_grid_deep_copy",(ulong)ref_grid_ptr_local._4_4_,"gather create");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 100,"ref_grid_deep_copy",(ulong)ref_grid_ptr_local._4_4_,"geom deep copy");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x59
               ,"ref_grid_deep_copy",(ulong)ref_grid_ptr_local._4_4_,"node deep copy");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x55,
             "ref_grid_deep_copy",(ulong)ref_grid_ptr_local._4_4_,"deep copy ref_mpi");
    }
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_deep_copy(REF_GRID *ref_grid_ptr,
                                      REF_GRID original) {
  REF_INT group;
  REF_GRID ref_grid;

  ref_malloc(*ref_grid_ptr, 1, REF_GRID_STRUCT);

  ref_grid = *ref_grid_ptr;

  RSS(ref_mpi_deep_copy(&ref_grid_mpi(ref_grid), ref_grid_mpi(original)),
      "deep copy ref_mpi");

  RSS(ref_node_deep_copy(&ref_grid_node(ref_grid), ref_grid_mpi(ref_grid),
                         ref_grid_node(original)),
      "node deep copy");

  for (group = 0; group < REF_CELL_N_TYPE; group++) {
    RSS(ref_cell_deep_copy(&ref_grid_cell(ref_grid, group),
                           ref_grid_cell(original, group)),
        "cell deep copy");
  }

  ref_grid_cell(ref_grid, REF_CELL_N_TYPE) = NULL;

  RSS(ref_geom_deep_copy(&ref_grid_geom(ref_grid), ref_grid_geom(original)),
      "geom deep copy");
  RSS(ref_gather_create(&ref_grid_gather(ref_grid)), "gather create");
  RSS(ref_adapt_deep_copy(&(ref_grid->adapt), original->adapt),
      "adapt deep copy");

  ref_grid_interp(ref_grid) = NULL;

  ref_grid_partitioner(ref_grid) = ref_grid_partitioner(original);
  ref_grid_partitioner_seed(ref_grid) = 0;
  ref_grid_partitioner_full(ref_grid) = ref_grid_partitioner_full(original);

  ref_grid_meshb_version(ref_grid) = 0;
  ref_grid_coordinate_system(ref_grid) = ref_grid_coordinate_system(original);
  ref_grid_unit(ref_grid) = ref_grid_unit(original);
  ref_grid_reference(ref_grid, 0) = ref_grid_reference(original, 0);
  ref_grid_reference(ref_grid, 1) = ref_grid_reference(original, 1);
  ref_grid_reference(ref_grid, 2) = ref_grid_reference(original, 2);
  ref_grid_reference(ref_grid, 3) = ref_grid_reference(original, 3);
  ref_grid_reference(ref_grid, 4) = ref_grid_reference(original, 4);
  ref_grid_reference(ref_grid, 5) = ref_grid_reference(original, 5);
  ref_grid_reference(ref_grid, 6) = ref_grid_reference(original, 6);

  ref_grid_twod(ref_grid) = ref_grid_twod(original);
  ref_grid_surf(ref_grid) = ref_grid_surf(original);

  return REF_SUCCESS;
}